

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

void internalSubsetDebug(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  char *pcVar1;
  
  callbacks = callbacks + 1;
  pcVar1 = "(null)";
  if (name != (xmlChar *)0x0) {
    pcVar1 = (char *)name;
  }
  fprintf((FILE *)SAXdebug,"SAX.internalSubset(%s,",pcVar1);
  if (ExternalID == (xmlChar *)0x0) {
    fwrite(" ,",2,1,(FILE *)SAXdebug);
  }
  else {
    fprintf((FILE *)SAXdebug," %s,",ExternalID);
  }
  if (SystemID != (xmlChar *)0x0) {
    fprintf((FILE *)SAXdebug," %s)\n",SystemID);
    return;
  }
  fwrite(" )\n",3,1,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
internalSubsetDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    callbacks++;
    if (quiet)
	return;
    if (name == NULL)
        name = BAD_CAST "(null)";
    fprintf(SAXdebug, "SAX.internalSubset(%s,", name);
    if (ExternalID == NULL)
	fprintf(SAXdebug, " ,");
    else
	fprintf(SAXdebug, " %s,", ExternalID);
    if (SystemID == NULL)
	fprintf(SAXdebug, " )\n");
    else
	fprintf(SAXdebug, " %s)\n", SystemID);
}